

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O2

void xml_show_fail(TestReporter *reporter,char *file,int line,char *message,__va_list_tag *arguments
                  )

{
  xmlChar *pxVar1;
  
  xmlTextWriterStartElement(child_output_writer,"failure");
  pxVar1 = xml_secure_vprint(message,arguments);
  xmlTextWriterWriteAttribute(child_output_writer,"message",pxVar1);
  (*_xmlFree)(pxVar1);
  xmlTextWriterStartElement(child_output_writer,"location");
  pxVar1 = xmlEscapePropValue(file);
  xmlTextWriterWriteAttribute(child_output_writer,"file",pxVar1);
  (*_xmlFree)(pxVar1);
  xmlTextWriterWriteFormatAttribute(child_output_writer,"line","%d",line);
  xmlTextWriterEndElement(child_output_writer);
  xmlTextWriterEndElement(child_output_writer);
  xmlTextWriterFlush(child_output_writer);
  return;
}

Assistant:

static void xml_show_fail(TestReporter *reporter, const char *file, int line,
                          const char *message, va_list arguments) {
    (void)reporter;

    xmlTextWriterStartElement(child_output_writer, XMLSTRING("failure"));

    xmlChar *xml_str = xml_secure_vprint(message, arguments);
    xmlTextWriterWriteAttribute(child_output_writer, XMLSTRING("message"), xml_str);
    xmlFree(xml_str);

    xmlTextWriterStartElement(child_output_writer, XMLSTRING("location"));
    xmlChar *xml_file = xmlEscapePropValue(file);
    xmlTextWriterWriteAttribute(child_output_writer, XMLSTRING("file"), xml_file);
    xmlFree(xml_file);
    xmlTextWriterWriteFormatAttribute(child_output_writer, XMLSTRING("line"), "%d", line);
    xmlTextWriterEndElement(child_output_writer); // </location>
    xmlTextWriterEndElement(child_output_writer); // </failure>
    xmlTextWriterFlush(child_output_writer);
}